

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZSTD_estimateDStreamSize_fromFrame(void *src,size_t srcSize)

{
  uint uVar1;
  size_t err;
  ZSTD_frameHeader zfh;
  U32 windowSizeMax;
  void *in_stack_ffffffffffffffa8;
  ZSTD_frameHeader *in_stack_ffffffffffffffb0;
  undefined8 local_48;
  size_t in_stack_ffffffffffffffc0;
  undefined8 local_8;
  
  local_8 = ZSTD_getFrameHeader(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,0x2f7a1a);
  uVar1 = ZSTD_isError(0x2f7a27);
  if (uVar1 == 0) {
    if (local_8 == 0) {
      if (local_48 < 0x80000001) {
        local_8 = ZSTD_estimateDStreamSize(in_stack_ffffffffffffffc0);
      }
      else {
        local_8 = 0xfffffffffffffff0;
      }
    }
    else {
      local_8 = 0xffffffffffffffb8;
    }
  }
  return local_8;
}

Assistant:

size_t ZSTD_estimateDStreamSize_fromFrame(const void* src, size_t srcSize)
{
    U32 const windowSizeMax = 1U << ZSTD_WINDOWLOG_MAX;   /* note : should be user-selectable, but requires an additional parameter (or a dctx) */
    ZSTD_frameHeader zfh;
    size_t const err = ZSTD_getFrameHeader(&zfh, src, srcSize);
    if (ZSTD_isError(err)) return err;
    RETURN_ERROR_IF(err>0, srcSize_wrong, "");
    RETURN_ERROR_IF(zfh.windowSize > windowSizeMax,
                    frameParameter_windowTooLarge, "");
    return ZSTD_estimateDStreamSize((size_t)zfh.windowSize);
}